

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O0

int ldhsecret(lua_State *L)

{
  uint64_t r_00;
  uint64_t r;
  uint64_t yy;
  uint64_t xx;
  uint32_t y [2];
  uint32_t x [2];
  lua_State *L_local;
  
  read64(L,y,(uint32_t *)&xx);
  if ((y == (uint32_t  [2])0x0) || (CONCAT44(xx._4_4_,(undefined4)xx) == 0)) {
    L_local._4_4_ = luaL_error(L,"Can\'t be 0");
  }
  else {
    r_00 = powmodp((uint64_t)y,CONCAT44(xx._4_4_,(undefined4)xx));
    push64(L,r_00);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int
ldhsecret(lua_State *L) {
	uint32_t x[2], y[2];
	read64(L, x, y);
	uint64_t xx = (uint64_t)x[0] | (uint64_t)x[1]<<32;
	uint64_t yy = (uint64_t)y[0] | (uint64_t)y[1]<<32;
	if (xx == 0 || yy == 0)
		return luaL_error(L, "Can't be 0");
	uint64_t r = powmodp(xx, yy);

	push64(L, r);

	return 1;
}